

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O1

void FACT_INTERNAL_OnBufferEnd(FAudioVoiceCallback *callback,void *pContext)

{
  code cVar1;
  uint uVar2;
  OnBufferEndFunc p_Var3;
  long *plVar4;
  code *pcVar5;
  FAudioVoiceCallback *pFVar6;
  uint uVar7;
  long lVar8;
  FAudioBufferWMA *pBufferWMA;
  int iVar9;
  uint uVar10;
  uint8_t *puVar11;
  FAudioSourceVoice *voice;
  code *pcVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  FAudioBufferWMA bufferWMA;
  uint local_b0;
  undefined1 local_a8 [16];
  uint local_98;
  undefined4 local_94;
  undefined8 local_90;
  code *local_88;
  uint8_t *local_80;
  long local_78;
  code *local_70;
  FAudioVoiceCallback *local_68;
  undefined1 local_60 [4];
  FAudioBuffer local_5c;
  
  p_Var3 = callback[1].OnBufferEnd;
  plVar4 = *(long **)p_Var3;
  lVar15 = (ulong)((uint)*(ushort *)(p_Var3 + 0x10) * 0x18) + plVar4[7];
  if ((p_Var3[0x2a] != (_func_void_FAudioVoiceCallback_ptr_void_ptr)0x0) &&
     (*(int *)(lVar15 + 0x14) != 0)) {
    uVar7 = *(int *)(lVar15 + 0x14) + *(int *)(lVar15 + 0x10);
    uVar13 = *(uint *)(lVar15 + 4);
    if ((uVar13 & 3) == 2) {
      uVar10 = uVar13 >> 0x17 & 0xff;
      iVar9 = (uVar13 >> 2 & 7) * (uVar10 + 0x16) * (uVar7 / (uVar10 * 2 + 0x20));
      goto LAB_0010f664;
    }
    if ((uVar13 & 3) == 0) {
      iVar9 = (uVar13 >> 2 & 7) * uVar7 << (byte)(uVar13 >> 0x1f);
      goto LAB_0010f664;
    }
  }
  iVar9 = *(int *)(lVar15 + 0xc);
LAB_0010f664:
  uVar10 = iVar9 + *(int *)(lVar15 + 8);
  uVar13 = *(uint *)(p_Var3 + 0x30);
  uVar7 = uVar10 - uVar13;
  if ((uVar13 <= uVar10 && uVar7 != 0) && (((byte)p_Var3[0x20] & 0x20) == 0)) {
    puVar11 = *(uint8_t **)(p_Var3 + 0x38);
    if (*(uint *)(p_Var3 + 0x2c) < uVar7) {
      uVar7 = *(uint *)(p_Var3 + 0x2c);
    }
    lVar8 = *plVar4;
    pcVar12 = *(code **)(lVar8 + 0x10);
    local_70 = *(code **)(lVar8 + 0x18);
    local_78 = plVar4[0xe];
    uVar2 = *(uint *)(plVar4 + 0xb);
    pcVar5 = *(code **)(lVar8 + 0xd8);
    local_94 = 0;
    local_90 = 0;
    local_a8._0_8_ = (uint32_t *)0x0;
    local_a8._8_8_ = 0;
    if (uVar2 == 0) {
      bVar16 = false;
      uVar14 = uVar7;
    }
    else {
      local_b0 = uVar13 % uVar2;
      bVar16 = local_b0 != 0;
      uVar13 = uVar13 - local_b0;
      uVar14 = local_b0 + uVar7;
      if (uVar14 % uVar2 != 0) {
        bVar16 = true;
        uVar14 = uVar14 + (uVar2 - uVar14 % uVar2);
      }
    }
    local_80 = puVar11;
    local_68 = callback;
    local_5c.AudioBytes = uVar7;
    local_5c.pAudioData = puVar11;
    if (bVar16) {
      if (*(uint *)(plVar4 + 0xd) < uVar14) {
        *(uint *)(plVar4 + 0xd) = uVar14;
        local_88 = pcVar12;
        lVar8 = (*pcVar5)(plVar4[0xc],uVar14);
        plVar4[0xc] = lVar8;
        pcVar12 = local_88;
      }
      puVar11 = (uint8_t *)plVar4[0xc];
    }
    lVar8 = local_78;
    local_98 = uVar13;
    iVar9 = (*pcVar12)(local_78,puVar11,uVar14,0);
    if (iVar9 == 0) {
      while ((uint32_t *)local_a8._0_8_ == (uint32_t *)0x103) {
        FAudio_sleep(0);
      }
    }
    (*local_70)(lVar8,local_a8,local_60,1);
    pFVar6 = local_68;
    if (bVar16) {
      SDL_memcpy(local_80,(ulong)local_b0 + plVar4[0xc],uVar7);
    }
    p_Var3 = pFVar6[1].OnBufferEnd;
    iVar9 = *(int *)(p_Var3 + 0x30);
    *(uint32_t *)(p_Var3 + 0x30) = iVar9 + local_5c.AudioBytes;
    local_5c.Flags = 0;
    if (uVar10 <= iVar9 + local_5c.AudioBytes) {
      cVar1 = p_Var3[0x2a];
      if (cVar1 == (code)0x0) {
        local_5c.Flags = 0x40;
      }
      else {
        if (cVar1 != (code)0xff) {
          p_Var3[0x2a] = (_func_void_FAudioVoiceCallback_ptr_void_ptr)((char)cVar1 + -1);
        }
        iVar9 = *(int *)(lVar15 + 8);
        *(int *)(p_Var3 + 0x30) = iVar9;
        uVar13 = *(uint *)(lVar15 + 4);
        if ((uVar13 & 3) == 2) {
          uVar7 = uVar13 >> 0x17 & 0xff;
          *(uint *)(p_Var3 + 0x30) =
               (uVar13 >> 2 & 7) * (uVar7 + 0x16) * (*(uint *)(lVar15 + 0x10) / (uVar7 * 2 + 0x20))
               + iVar9;
        }
        else if ((uVar13 & 3) == 0) {
          *(uint *)(p_Var3 + 0x30) =
               ((uVar13 >> 2 & 7) * *(int *)(lVar15 + 0x10) << (byte)(uVar13 >> 0x1f)) + iVar9;
        }
      }
    }
    local_5c.LoopCount = 0;
    local_5c.pContext = (void *)0x0;
    local_5c.PlayBegin = 0;
    local_5c.PlayLength = 0;
    local_5c.LoopBegin = 0;
    local_5c.LoopLength = 0;
    if ((~*(uint *)(lVar15 + 4) & 3) == 0) {
      local_a8._0_8_ =
           *(long *)(*(long *)(*(long *)p_Var3 + 0x48) + 8 +
                    (ulong)*(ushort *)(p_Var3 + 0x10) * 0x10);
      pBufferWMA = (FAudioBufferWMA *)local_a8;
      local_a8._8_4_ =
           *(undefined4 *)
            (*(long *)(*(long *)p_Var3 + 0x48) + (ulong)*(ushort *)(p_Var3 + 0x10) * 0x10);
      voice = *(FAudioSourceVoice **)(p_Var3 + 0x48);
    }
    else {
      voice = *(FAudioSourceVoice **)(p_Var3 + 0x48);
      pBufferWMA = (FAudioBufferWMA *)0x0;
    }
    FAudioSourceVoice_SubmitSourceBuffer(voice,&local_5c,pBufferWMA);
  }
  return;
}

Assistant:

void FACT_INTERNAL_OnBufferEnd(FAudioVoiceCallback *callback, void* pContext)
{
	FAudioBuffer buffer;
	FAudioBufferWMA bufferWMA;
	FACTWaveCallback *c = (FACTWaveCallback*) callback;
	FACTWaveBankEntry *entry;
	uint32_t end, left, length;

	entry = &c->wave->parentBank->entries[c->wave->index];

	/* Calculate total bytes left in this wave iteration */
	if (c->wave->loopCount > 0 && entry->LoopRegion.dwTotalSamples > 0)
	{
		length = entry->LoopRegion.dwStartSample + entry->LoopRegion.dwTotalSamples;
		if (entry->Format.wFormatTag == 0x0)
		{
			length = (
				length *
				entry->Format.nChannels *
				(1 << entry->Format.wBitsPerSample)
			);
		}
		else if (entry->Format.wFormatTag == 0x2)
		{
			length = (
				length /
				/* wSamplesPerBlock */
				((entry->Format.wBlockAlign + 16) * 2) *
				/* nBlockAlign */
				((entry->Format.wBlockAlign + 22) * entry->Format.nChannels)
			);
		}
		else
		{
			length = entry->PlayRegion.dwLength;
		}
	}
	else
	{
		length = entry->PlayRegion.dwLength;
	}
	end = entry->PlayRegion.dwOffset + length;
	left = length - (c->wave->streamOffset - entry->PlayRegion.dwOffset);

	/* Don't bother if we're EOS or the Wave has stopped */
	if (	(c->wave->streamOffset >= end) ||
		(c->wave->state & FACT_STATE_STOPPED)	)
	{
		return;
	}

	/* Assign buffer memory */
	buffer.pAudioData = c->wave->streamCache;
	buffer.AudioBytes = FAudio_min(
		c->wave->streamSize,
		left
	);

	/* Read! */
	FACT_INTERNAL_ReadFile(
		c->wave->parentBank->parentEngine->pReadFile,
		c->wave->parentBank->parentEngine->pGetOverlappedResult,
		c->wave->parentBank->io,
		c->wave->streamOffset,
		c->wave->parentBank->packetSize,
		&c->wave->parentBank->packetBuffer,
		&c->wave->parentBank->packetBufferLen,
		c->wave->parentBank->parentEngine->pRealloc,
		c->wave->streamCache,
		buffer.AudioBytes
	);
	c->wave->streamOffset += buffer.AudioBytes;

	/* Last buffer in the stream? */
	buffer.Flags = 0;
	if (c->wave->streamOffset >= end)
	{
		/* Loop if applicable */
		if (c->wave->loopCount > 0)
		{
			if (c->wave->loopCount != 255)
			{
				c->wave->loopCount -= 1;
			}
			c->wave->streamOffset = entry->PlayRegion.dwOffset;

			/* Loop start */
			if (entry->Format.wFormatTag == 0x0)
			{
				c->wave->streamOffset += (
					entry->LoopRegion.dwStartSample *
					entry->Format.nChannels *
					(1 << entry->Format.wBitsPerSample)
				);
			}
			else if (entry->Format.wFormatTag == 0x2)
			{
				c->wave->streamOffset += (
					entry->LoopRegion.dwStartSample /
					/* wSamplesPerBlock */
					((entry->Format.wBlockAlign + 16) * 2) *
					/* nBlockAlign */
					((entry->Format.wBlockAlign + 22) * entry->Format.nChannels)
				);
			}
		}
		else
		{
			buffer.Flags = FAUDIO_END_OF_STREAM;
		}
	}

	/* Unused properties */
	buffer.PlayBegin = 0;
	buffer.PlayLength = 0;
	buffer.LoopBegin = 0;
	buffer.LoopLength = 0;
	buffer.LoopCount = 0;
	buffer.pContext = NULL;

	/* Submit, finally. */
	if (entry->Format.wFormatTag == 0x3)
	{
		bufferWMA.pDecodedPacketCumulativeBytes =
			c->wave->parentBank->seekTables[c->wave->index].entries;
		bufferWMA.PacketCount =
			c->wave->parentBank->seekTables[c->wave->index].entryCount;
		FAudioSourceVoice_SubmitSourceBuffer(
			c->wave->voice,
			&buffer,
			&bufferWMA
		);
	}
	else
	{
		FAudioSourceVoice_SubmitSourceBuffer(
			c->wave->voice,
			&buffer,
			NULL
		);
	}
}